

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O3

QSize __thiscall QTabWidget::minimumSizeHint(QTabWidget *this)

{
  QTabWidgetPrivate *this_00;
  QWidget *pQVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  QPalette *pQVar7;
  QStyle *pQVar8;
  QSize QVar9;
  int iVar10;
  int iVar11;
  QTabWidget *that;
  int iVar13;
  int iVar14;
  uint uVar15;
  undefined8 uVar16;
  int iVar17;
  long in_FS_OFFSET;
  QStyleOptionTabWidgetFrame opt;
  int local_d8;
  ulong local_c8;
  QStyleOptionTabWidgetFrame local_c0;
  long local_38;
  ulong uVar12;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabWidgetPrivate **)&(this->super_QWidget).field_0x8;
  pQVar1 = this_00->leftCornerWidget;
  iVar13 = 0;
  uVar4 = 0;
  iVar10 = 0;
  if (pQVar1 != (QWidget *)0x0) {
    uVar4 = 0;
    iVar10 = 0;
    if ((pQVar1->data->widget_attributes & 0x8000) != 0) {
      uVar4 = (**(code **)(*(long *)pQVar1 + 0x78))();
      iVar10 = (int)((ulong)uVar4 >> 0x20);
    }
  }
  pQVar1 = this_00->rightCornerWidget;
  if (pQVar1 == (QWidget *)0x0) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    if ((pQVar1->data->widget_attributes & 0x8000) != 0) {
      uVar16 = (**(code **)(*(long *)pQVar1 + 0x78))();
      iVar13 = (int)((ulong)uVar16 >> 0x20);
    }
  }
  if (this_00->dirty == false) {
    setUpLayout(this,true);
  }
  uVar5 = (**(code **)(*(long *)&(this_00->stack->super_QFrame).super_QWidget + 0x78))();
  bVar2 = QTabWidgetPrivate::isAutoHidden(this_00);
  iVar11 = -1;
  uVar6 = 0xffffffff;
  if (!bVar2) {
    uVar6 = (**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x78))();
    iVar11 = (int)((ulong)uVar6 >> 0x20);
  }
  iVar14 = (int)uVar16;
  iVar3 = (int)uVar6;
  iVar17 = (int)(uVar5 >> 0x20);
  local_d8 = (int)uVar4;
  if (this_00->pos < West) {
    uVar15 = iVar14 + local_d8 + iVar3;
    local_c8 = (ulong)uVar15;
    if ((int)uVar15 <= (int)uVar5) {
      local_c8 = uVar5 & 0xffffffff;
    }
    if (iVar11 < iVar10) {
      iVar11 = iVar10;
    }
    if (iVar11 <= iVar13) {
      iVar11 = iVar13;
    }
    uVar12 = (ulong)(uint)(iVar11 + iVar17);
  }
  else {
    if (iVar3 < local_d8) {
      iVar3 = local_d8;
    }
    if (iVar3 <= iVar14) {
      iVar3 = iVar14;
    }
    uVar15 = iVar13 + iVar10 + iVar11;
    uVar12 = (ulong)uVar15;
    if ((int)uVar15 <= iVar17) {
      uVar12 = uVar5 >> 0x20;
    }
    local_c8 = (ulong)(uint)(iVar3 + (int)uVar5);
  }
  local_c8 = local_c8 | uVar12 << 0x20;
  memset(&local_c0,0xaa,0x88);
  QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame(&local_c0);
  (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,&local_c0);
  pQVar7 = QWidget::palette(&this->super_QWidget);
  QPalette::operator=(&local_c0.super_QStyleOption.palette,pQVar7);
  local_c0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x0;
  pQVar8 = QWidget::style(&this->super_QWidget);
  QVar9 = (QSize)(**(code **)(*(long *)pQVar8 + 0xe8))(pQVar8,0x11,&local_c0,&local_c8,this);
  QStyleOption::~QStyleOption(&local_c0.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar9;
  }
  __stack_chk_fail();
}

Assistant:

QSize QTabWidget::minimumSizeHint() const
{
    Q_D(const QTabWidget);
    QSize lc(0, 0), rc(0, 0);

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible())
        lc = d->leftCornerWidget->minimumSizeHint();
    if (d->rightCornerWidget && d->rightCornerWidget->isVisible())
        rc = d->rightCornerWidget->minimumSizeHint();
    if (!d->dirty) {
        QTabWidget *that = const_cast<QTabWidget*>(this);
        that->setUpLayout(true);
    }
    QSize s(d->stack->minimumSizeHint());
    QSize t;
    if (!d->isAutoHidden())
        t = d->tabs->minimumSizeHint();

    QSize sz = basicSize(d->pos == North || d->pos == South, lc, rc, s, t);

    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.palette = palette();
    opt.state = QStyle::State_None;
    return style()->sizeFromContents(QStyle::CT_TabWidget, &opt, sz, this);
}